

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndTabBar(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiPtrOrIndex *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiTabBar *pIVar6;
  float fVar7;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    pIVar6 = GImGui->CurrentTabBar;
    if (pIVar6 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Mismatched BeginTabBar()/EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x19fc,"void ImGui::EndTabBar()");
    }
    if (pIVar6->WantLayout == true) {
      TabBarLayout(pIVar6);
    }
    if (((pIVar6->VisibleTabWasSubmitted == false) && (pIVar6->VisibleTabId != 0)) &&
       (pIVar4->FrameCount <= pIVar6->PrevFrameVisible + 1)) {
      (pIVar2->DC).CursorPos.y = (pIVar6->BarRect).Max.y + pIVar6->LastTabContentHeight;
    }
    else {
      fVar7 = (pIVar2->DC).CursorPos.y - (pIVar6->BarRect).Max.y;
      pIVar6->LastTabContentHeight = (float)(-(uint)(0.0 <= fVar7) & (uint)fVar7);
    }
    if ((pIVar6->Flags & 0x100000) == 0) {
      PopID();
    }
    iVar1 = (pIVar4->CurrentTabBarStack).Size;
    if (iVar1 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x544,"void ImVector<ImGuiPtrOrIndex>::pop_back() [T = ImGuiPtrOrIndex]");
    }
    uVar5 = iVar1 - 1;
    (pIVar4->CurrentTabBarStack).Size = uVar5;
    if (uVar5 == 0) {
      pIVar6 = (ImGuiTabBar *)0x0;
    }
    else {
      pIVar3 = (pIVar4->CurrentTabBarStack).Data;
      pIVar6 = (ImGuiTabBar *)pIVar3[(ulong)uVar5 - 1].Ptr;
      if (pIVar6 == (ImGuiTabBar *)0x0) {
        iVar1 = pIVar3[(ulong)uVar5 - 1].Index;
        if ((GImGui->TabBars).Buf.Size <= iVar1) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                        ,0x52e,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
        }
        pIVar6 = (GImGui->TabBars).Buf.Data + iVar1;
      }
    }
    pIVar4->CurrentTabBar = pIVar6;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
        tab_bar->LastTabContentHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, 0.0f);
    else
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->LastTabContentHeight;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}